

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_insn_t_conflict
MIR_new_insn_arr(MIR_context_t ctx,MIR_insn_code_t code,size_t nops,MIR_op_t *ops)

{
  byte bVar1;
  VARR_MIR_proto_t *pVVar2;
  MIR_var_t *pMVar3;
  MIR_error_func_t p_Var4;
  size_t sVar5;
  MIR_proto_t *ppMVar6;
  MIR_proto_t pMVar7;
  MIR_insn_t_conflict pMVar8;
  MIR_proto_t pMVar9;
  ulong uVar10;
  char *pcVar11;
  size_t extraout_RDX;
  char *pcVar12;
  MIR_error_type_t MVar13;
  MIR_proto_t pMVar14;
  long lVar16;
  long *unaff_R13;
  MIR_error_func_t local_30;
  ulong uVar15;
  
  sVar5 = insn_code_nops(ctx,code);
  if (ops == (MIR_op_t *)0x0 && nops != 0) {
LAB_00133233:
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  if (code - MIR_SWITCH < 0xfffffffd) {
    if ((int)code < 0xb5) {
      if (code == MIR_SWITCH) goto LAB_00132f3e;
      if (code != MIR_RET) goto LAB_00132f1f;
    }
    else if ((code != MIR_UNSPEC) && (code != MIR_USE)) {
      if (code != MIR_PHI) {
LAB_00132f1f:
        if (sVar5 != nops) goto LAB_0013338c;
        goto LAB_00132f28;
      }
      goto LAB_00132fd6;
    }
LAB_00132f54:
    if ((int)code < 0xb0) {
      if (code - MIR_CALL < 3) {
LAB_00132f72:
        uVar10 = (ulong)(code != MIR_UNSPEC) + 1;
        if (nops < uVar10) goto LAB_00133347;
        if (code == MIR_UNSPEC) {
          if (ops->field_0x8 != '\x03') {
LAB_00133363:
            pcVar12 = "the 1st unspec operand should be valid unspec code";
            MVar13 = MIR_unspec_op_error;
            goto LAB_00133387;
          }
          pVVar2 = ctx->unspec_protos;
          if (pVVar2 == (VARR_MIR_proto_t *)0x0) {
            MIR_new_insn_arr_cold_6();
          }
          else {
            if (pVVar2->els_num <= (ops->u).u) goto LAB_00133363;
            if (pVVar2->varr != (MIR_proto_t *)0x0) {
              ppMVar6 = pVVar2->varr + (ops->u).u;
              goto LAB_0013306e;
            }
          }
          MIR_new_insn_arr_cold_5();
LAB_0013337b:
          pcVar12 = "property should be a integer operand";
LAB_00133382:
          MVar13 = MIR_op_mode_error;
          goto LAB_00133387;
        }
        if ((ops->field_0x8 != '\b') || (*(int *)&((ops->u).label)->ops[0].data != 1)) {
          pcVar12 = "the 1st call operand should be a prototype";
          MVar13 = MIR_call_op_error;
          goto LAB_00133387;
        }
        ppMVar6 = (MIR_proto_t *)((long)&((ops->u).label)->ops[0].u + 0x10);
LAB_0013306e:
        pMVar9 = *ppMVar6;
        pMVar7 = (MIR_proto_t)(ulong)pMVar9->nres;
        pcVar12 = (char *)pMVar9->args;
        pMVar14 = pMVar7;
        if ((VARR_MIR_var_t *)pcVar12 != (VARR_MIR_var_t *)0x0) {
          pMVar14 = (MIR_proto_t)((long)&pMVar7->name + ((VARR_MIR_var_t *)pcVar12)->els_num);
        }
        uVar15 = (long)&pMVar14->name + uVar10;
        if (nops < uVar15) goto LAB_00133316;
        if ((uVar15 != nops) && (pMVar9->vararg_p == '\0')) goto LAB_00133316;
        pMVar9 = (MIR_proto_t)(nops - uVar10);
        if (uVar10 <= nops && pMVar9 != (MIR_proto_t)0x0) {
          pMVar14 = (MIR_proto_t)0x0;
          unaff_R13 = (long *)((long)&ops->u + (ulong)(uint)((int)uVar10 * 0x30) + 0x18);
          lVar16 = (long)pMVar7 * -0x18;
          do {
            if (((char)unaff_R13[-4] == '\n') &&
               (bVar1 = *(byte *)(unaff_R13 + -3), 0xfffffff9 < bVar1 - 0x12)) {
              sVar5 = (long)pMVar14 - (long)pMVar7;
              if (pMVar14 < pMVar7) {
LAB_0013320d:
                pcVar12 = "result of %s is block type memory";
LAB_001332c0:
                pcVar11 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar11 = "unspec";
                }
                MVar13 = MIR_wrong_type_error;
                goto LAB_001332c9;
              }
              if ((VARR_MIR_var_t *)pcVar12 == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_2();
                goto LAB_00133233;
              }
              if ((ulong)(-(long)pMVar7 + (long)pMVar14) < ((VARR_MIR_var_t *)pcVar12)->els_num) {
                pMVar3 = ((VARR_MIR_var_t *)pcVar12)->varr;
                if (pMVar3 == (MIR_var_t *)0x0) goto LAB_00133311;
                if (*(uint *)((long)&pMVar3->type + lVar16) != (uint)bVar1) {
                  pcVar12 = "arg of %s is block type memory but param is not of block type";
                  goto LAB_001332c0;
                }
                if (*(long *)((long)&pMVar3->size + lVar16) != *unaff_R13) goto LAB_001332ce;
              }
              else if (bVar1 == 0x11) {
LAB_00133286:
                pcVar12 = "RBLK memory can not correspond to unnamed param in %s insn";
                goto LAB_001332c0;
              }
            }
            else if (pMVar7 <= pMVar14) {
              if ((VARR_MIR_var_t *)pcVar12 == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_4();
                goto LAB_0013320d;
              }
              if ((ulong)(-(long)pMVar7 + (long)pMVar14) < ((VARR_MIR_var_t *)pcVar12)->els_num) {
                if (((VARR_MIR_var_t *)pcVar12)->varr == (MIR_var_t *)0x0) {
                  MIR_new_insn_arr_cold_3();
                  goto LAB_00133286;
                }
                if (0xfffffff9 <
                    *(int *)((long)&((VARR_MIR_var_t *)pcVar12)->varr->type + lVar16) - 0x12U) {
                  pcVar12 = "param of %s is of block type but arg is not of block type memory";
                  goto LAB_001332c0;
                }
              }
            }
            pMVar14 = (MIR_proto_t)((long)&pMVar14->name + 1);
            lVar16 = lVar16 + 0x18;
            unaff_R13 = unaff_R13 + 6;
          } while (pMVar9 != pMVar14);
        }
      }
      else {
LAB_00133013:
        if (code - MIR_PRBEQ < 2) {
          if (ops[2].field_0x8 != '\x03') goto LAB_0013337b;
          if ((ops[1].field_0x8 != '\x01') && (ops[1].field_0x8 != '\n')) {
            pcVar12 = "2nd operand of property branch should be any memory or reg with given type";
            goto LAB_00133382;
          }
        }
      }
    }
    else if (code == MIR_VA_ARG) {
      if (ops[2].field_0x8 != '\n') {
        pcVar12 = "3rd operand of va_arg should be any memory with given type";
        goto LAB_00133382;
      }
    }
    else {
      if (code != MIR_PRSET) {
        if (code != MIR_UNSPEC) goto LAB_00133013;
        goto LAB_00132f72;
      }
      if (ops[1].field_0x8 != '\x03') goto LAB_0013337b;
    }
  }
  else {
LAB_00132f28:
    if (code == MIR_PHI) {
LAB_00132fd6:
      if (nops < 3) {
        pcVar12 = "number of MIR_PHI operands is less 3";
        goto LAB_0013334e;
      }
    }
    else {
      if (code != MIR_SWITCH) goto LAB_00132f54;
LAB_00132f3e:
      if (nops < 2) {
        pcVar12 = "number of MIR_SWITCH operands is less 2";
        goto LAB_0013334e;
      }
    }
  }
  pMVar8 = (MIR_insn_t_conflict)malloc((nops + (nops == 0)) * 0x30 + 0x20);
  if (pMVar8 != (MIR_insn_t_conflict)0x0) {
    pMVar8->data = (void *)0x0;
    *(size_t *)&pMVar8->field_0x18 = nops << 0x20 | (ulong)code;
    if (nops != 0) {
      memcpy(pMVar8->ops,ops,nops * 0x30);
    }
    return pMVar8;
  }
  pcVar12 = "Not enough memory for insn creation";
  MVar13 = MIR_alloc_error;
LAB_00133387:
  do {
    (*ctx->error_func)(MVar13,pcVar12);
LAB_0013338c:
    pcVar12 = "wrong number of operands for insn %s";
    MVar13 = MIR_ops_num_error;
    pcVar11 = insn_descs[code].name;
LAB_001332c9:
    (*ctx->error_func)(MVar13,pcVar12,pcVar11);
    sVar5 = extraout_RDX;
LAB_001332ce:
    p_Var4 = ctx->error_func;
    ctx = (MIR_context_t)&stack0xffffffffffffffc0;
    VARR_MIR_var_tget((MIR_var_t *)ctx,(VARR_MIR_var_t *)pcVar12,sVar5);
    pMVar9 = (MIR_proto_t)*unaff_R13;
    pcVar12 = "call";
    if (code == MIR_UNSPEC) {
      pcVar12 = "unspec";
    }
    (*p_Var4)(MIR_wrong_type_error,
              "different sizes (%lu vs %lu) of arg and param block memory in %s insn",local_30,
              pMVar9,pcVar12);
LAB_00133311:
    MIR_new_insn_arr_cold_1();
LAB_00133316:
    pcVar12 = "call";
    if (code == MIR_UNSPEC) {
      pcVar12 = "unspec";
    }
    (*ctx->error_func)(code == MIR_UNSPEC | MIR_call_op_error,
                       "number of %s operands or results does not correspond to prototype %s",
                       pcVar12,pMVar9->name);
LAB_00133347:
    pcVar12 = "wrong number of call/unspec operands";
LAB_0013334e:
    MVar13 = MIR_ops_num_error;
  } while( true );
}

Assistant:

MIR_insn_t MIR_new_insn_arr (MIR_context_t ctx, MIR_insn_code_t code, size_t nops, MIR_op_t *ops) {
  MIR_insn_t insn;
  MIR_proto_t proto;
  size_t args_start, narg, i = 0, expected_nops = insn_code_nops (ctx, code);
  mir_assert (nops == 0 || ops != NULL);

  if (!MIR_call_code_p (code) && code != MIR_UNSPEC && code != MIR_USE && code != MIR_PHI
      && code != MIR_RET && code != MIR_SWITCH && nops != expected_nops) {
    MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of operands for insn %s",
                              insn_descs[code].name);
  } else if (code == MIR_SWITCH) {
    if (nops < 2)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_SWITCH operands is less 2");
  } else if (code == MIR_PHI) {
    if (nops < 3)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_PHI operands is less 3");
  } else if (MIR_call_code_p (code) || code == MIR_UNSPEC) {
    args_start = code == MIR_UNSPEC ? 1 : 2;
    if (nops < args_start)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of call/unspec operands");
    if (code == MIR_UNSPEC) {
      if (ops[0].mode != MIR_OP_INT || ops[0].u.u >= VARR_LENGTH (MIR_proto_t, unspec_protos))
        MIR_get_error_func (ctx) (MIR_unspec_op_error,
                                  "the 1st unspec operand should be valid unspec code");
      proto = VARR_GET (MIR_proto_t, unspec_protos, ops[0].u.u);
    } else {
      if (ops[0].mode != MIR_OP_REF || ops[0].u.ref->item_type != MIR_proto_item)
        MIR_get_error_func (ctx) (MIR_call_op_error, "the 1st call operand should be a prototype");
      proto = ops[0].u.ref->u.proto;
    }
    i = proto->nres;
    if (proto->args != NULL) i += VARR_LENGTH (MIR_var_t, proto->args);
    if (nops < i + args_start || (nops != i + args_start && !proto->vararg_p))
      MIR_get_error_func (
        ctx) (code == MIR_UNSPEC ? MIR_unspec_op_error : MIR_call_op_error,
              "number of %s operands or results does not correspond to prototype %s",
              code == MIR_UNSPEC ? "unspec" : "call", proto->name);
    for (i = args_start; i < nops; i++) {
      if (ops[i].mode == MIR_OP_MEM && MIR_all_blk_type_p (ops[i].u.mem.type)) {
        if (i - args_start < proto->nres)
          MIR_get_error_func (ctx) (MIR_wrong_type_error, "result of %s is block type memory",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        else if ((narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)) {
          if (VARR_GET (MIR_var_t, proto->args, narg).type != ops[i].u.mem.type) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "arg of %s is block type memory but param is not of block type",
                    code == MIR_UNSPEC ? "unspec" : "call");
          } else if (VARR_GET (MIR_var_t, proto->args, narg).size != (size_t) ops[i].u.mem.disp) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                    (unsigned long) VARR_GET (MIR_var_t, proto->args, narg).size,
                    (unsigned long) ops[i].u.mem.disp, code == MIR_UNSPEC ? "unspec" : "call");
          }
        } else if (ops[i].u.mem.type == MIR_T_RBLK) {
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "RBLK memory can not correspond to unnamed param in %s insn",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        }
      } else if (i - args_start >= proto->nres
                 && (narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)
                 && MIR_all_blk_type_p (VARR_GET (MIR_var_t, proto->args, narg).type)) {
        MIR_get_error_func (
          ctx) (MIR_wrong_type_error,
                "param of %s is of block type but arg is not of block type memory",
                code == MIR_UNSPEC ? "unspec" : "call");
      }
    }
  } else if (code == MIR_VA_ARG) {  // undef mem ???
    if (ops[2].mode != MIR_OP_MEM)
      MIR_get_error_func (ctx) (MIR_op_mode_error,
                                "3rd operand of va_arg should be any memory with given type");
  } else if (code == MIR_PRSET) {
    if (ops[1].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
  } else if (code == MIR_PRBEQ || code == MIR_PRBNE) {
    if (ops[2].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
    if (ops[1].mode != MIR_OP_REG && ops[1].mode != MIR_OP_MEM)
      MIR_get_error_func (
        ctx) (MIR_op_mode_error,
              "2nd operand of property branch should be any memory or reg with given type");
  }
  insn = create_insn (ctx, nops, code);
  insn->nops = (unsigned int) nops;
  for (i = 0; i < nops; i++) insn->ops[i] = ops[i];
  return insn;
}